

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_upgrade2ws(http_s *h,websocket_settings_s args)

{
  int iVar1;
  
  if (h == (http_s *)0x0) {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: `http_upgrade2ws` requires a valid `http_s` handle.");
    }
  }
  else if (((h->method != 0) || (h->status_str != 0)) || (h->status == 0)) {
    iVar1 = (**(code **)((long)(h->private_data).vtbl + 0x28))(h,&args);
    return iVar1;
  }
  if (args.on_close != (_func_void_intptr_t_void_ptr *)0x0) {
    (*args.on_close)(-1,args.udata);
  }
  return -1;
}

Assistant:

int http_upgrade2ws(http_s *h, websocket_settings_s args) {
  if (!h) {
    FIO_LOG_ERROR("`http_upgrade2ws` requires a valid `http_s` handle.");
    goto error;
  }
  if (HTTP_INVALID_HANDLE(h))
    goto error;
  return ((http_vtable_s *)h->private_data.vtbl)->http2websocket(h, &args);
error:
  if (args.on_close)
    args.on_close(-1, args.udata);
  return -1;
}